

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZLinearAnalysis.cpp
# Opt level: O2

TPZMatrixSolver<double> * __thiscall
TPZLinearAnalysis::MatrixSolver<double>(TPZLinearAnalysis *this)

{
  TPZMatrixSolver<double> *pTVar1;
  
  pTVar1 = (TPZMatrixSolver<double> *)
           __dynamic_cast((this->super_TPZAnalysis).fSolver,&TPZSolver::typeinfo,
                          &TPZMatrixSolver<double>::typeinfo,0);
  if (pTVar1 != (TPZMatrixSolver<double> *)0x0) {
    return pTVar1;
  }
  std::operator<<((ostream *)&std::cerr,
                  "TPZMatrixSolver<TVar> &TPZLinearAnalysis::MatrixSolver() [TVar = double]");
  std::operator<<((ostream *)&std::cerr," incompatible Solver type! Aborting\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZLinearAnalysis.cpp"
             ,0x125);
}

Assistant:

TPZMatrixSolver<TVar> &TPZLinearAnalysis::MatrixSolver(){
    const auto tmp = dynamic_cast<TPZMatrixSolver<TVar>*>(fSolver);
    if(fSolver && !tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible Solver type! Aborting\n";
        DebugStop();
    }
    return *tmp;
}